

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O3

size_t __thiscall
hrvo::Simulator::addAgent
          (Simulator *this,Vector2 *position,size_t goalNo,float neighborDist,size_t maxNeighbors,
          float radius,float goalRadius,float prefSpeed,float maxSpeed,float uncertaintyOffset,
          float maxAccel,Vector2 *velocity,float orientation)

{
  iterator __position;
  Agent *this_00;
  pointer ppAVar1;
  Agent *agent;
  Agent *local_38;
  
  this_00 = (Agent *)operator_new(0xd8);
  Agent::Agent(this_00,this,position,goalNo,neighborDist,maxNeighbors,radius,velocity,maxAccel,
               goalRadius,prefSpeed,maxSpeed,orientation,uncertaintyOffset);
  __position._M_current =
       (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_38 = this_00;
    std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::_M_realloc_insert
              (&this->agents_,__position,&local_38);
    ppAVar1 = (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = this_00;
    ppAVar1 = (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish + 1;
    (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppAVar1;
  }
  return ((long)ppAVar1 -
          (long)(this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
}

Assistant:

std::size_t Simulator::addAgent(const Vector2 &position, std::size_t goalNo,
                                float neighborDist, std::size_t maxNeighbors,
                                float radius, float goalRadius, float prefSpeed,
                                float maxSpeed,
#if HRVO_DIFFERENTIAL_DRIVE
                                float timeToOrientation, float wheelTrack,
#endif /* HRVO_DIFFERENTIAL_DRIVE */
                                float uncertaintyOffset, float maxAccel,
                                const Vector2 &velocity, float orientation) {
  Agent *const agent = new Agent(this, position, goalNo, neighborDist,
                                 maxNeighbors, radius, velocity, maxAccel,
                                 goalRadius, prefSpeed, maxSpeed, orientation,
#if HRVO_DIFFERENTIAL_DRIVE
                                 timeToOrientation, wheelTrack,
#endif /* HRVO_DIFFERENTIAL_DRIVE */
                                 uncertaintyOffset);
  agents_.push_back(agent);

  return agents_.size() - 1U;
}